

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructions.c
# Opt level: O1

int parse_arguments(pExecutor exec,pUserFunction func,Expr *args,int argc)

{
  int iVar1;
  Expr *__ptr;
  Expr *pEVar2;
  Expr *pEVar3;
  undefined4 uVar4;
  uint *opt_pos_00;
  Expr *arg;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  Expr EVar9;
  Expr expr;
  int rest_pos;
  int opt_pos;
  int local_50;
  uint local_4c;
  ulong local_48;
  pUserFunction local_40;
  long local_38;
  
  opt_pos_00 = &local_4c;
  iVar1 = scan_arguments(exec,args,argc,(int *)opt_pos_00,&local_50);
  uVar4 = SUB84(opt_pos_00,0);
  if (iVar1 != 0) {
    lVar5 = (long)(int)local_4c;
    local_38 = (long)local_50;
    uVar6 = ~local_4c + local_50;
    uVar7 = 0;
    if (0 < (int)uVar6) {
      uVar7 = uVar6;
    }
    local_40 = func;
    __ptr = (Expr *)malloc(lVar5 * 0x10);
    if (__ptr == (Expr *)0x0) {
      puts("parse_arguments: malloc failed");
      return 0;
    }
    local_48 = (ulong)local_4c;
    pEVar2 = (Expr *)malloc((ulong)uVar7 << 4);
    if (pEVar2 == (Expr *)0x0) {
      puts("parse_arguments: malloc failed");
    }
    else {
      pEVar3 = (Expr *)malloc((ulong)uVar7 << 4);
      if (pEVar3 != (Expr *)0x0) {
        if (0 < (int)local_48) {
          memcpy(__ptr,args,local_48 << 4);
        }
        if (0 < (int)uVar6) {
          lVar8 = 0;
          do {
            arg = (Expr *)((long)&pEVar2->type + lVar8);
            expr._4_4_ = 0;
            expr.type = *(uint *)((long)&args[lVar5 + 1].type + lVar8);
            expr.field_1.val_atom =
                 ((anon_union_8_8_707b72ea_for_Expr_1 *)((long)&args[lVar5 + 1].field_1 + lVar8))->
                 val_atom;
            parse_opt_arg(exec,expr,arg,(Expr *)((long)&pEVar3->type + lVar8));
            uVar4 = SUB84(arg,0);
            lVar8 = lVar8 + 0x10;
          } while ((ulong)uVar6 << 4 != lVar8);
        }
        if ((int)local_38 == argc) {
          EVar9 = make_none();
        }
        else {
          EVar9._4_4_ = 0;
          EVar9.type = args[local_38 + 1].type;
          uVar4 = *(undefined4 *)&args[local_38 + 1].field_0x4;
          EVar9.field_1.val_atom = args[local_38 + 1].field_1.val_atom;
        }
        local_40->args = __ptr;
        local_40->argc = (int)local_48;
        local_40->opt = pEVar2;
        local_40->def = pEVar3;
        local_40->optc = uVar7;
        (local_40->rest).type = EVar9.type;
        *(undefined4 *)&(local_40->rest).field_0x4 = uVar4;
        (local_40->rest).field_1.val_atom = (size_t)EVar9.field_1;
        return 1;
      }
      puts("parse_arguments: malloc failed");
      free(__ptr);
      __ptr = pEVar2;
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

int parse_arguments(pExecutor exec, pUserFunction func, Expr *args, int argc)
{
    int opt_pos, rest_pos;
    if (!scan_arguments(exec, args, argc, &opt_pos, &rest_pos))
        return 0;

    int req_len = opt_pos;
    int opt_len = rest_pos - opt_pos - 1;
    if (opt_len < 0) opt_len = 0;
    int rest_len = argc - rest_pos;

    Expr *req, *opt, *def, rest;

    req = malloc(req_len * sizeof(Expr));
    if (req == NULL)
    {
        log("parse_arguments: malloc failed");
        return 0;
    }
    opt = malloc(opt_len * sizeof(Expr));
    if (opt == NULL)
    {
        log("parse_arguments: malloc failed");
        free(req);
        return 0;
    }
    def = malloc(opt_len * sizeof(Expr));
    if (def == NULL)
    {
        log("parse_arguments: malloc failed");
        free(req);
        free(opt);
        return 0;
    }

    for (int i = 0; i < req_len; i++)
        req[i] = args[i];
    for (int i = 0; i < opt_len; i++)
        parse_opt_arg(exec, args[opt_pos + 1 + i], opt + i, def + i);
    if (rest_len != 0)
        rest = args[rest_pos + 1];
    else
        rest = make_none();

    func->args = req;
    func->argc = req_len;
    func->opt = opt;
    func->def = def;
    func->optc = opt_len;
    func->rest = rest;

    return 1;
}